

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzDecompressEnd(bz_stream *strm)

{
  long *plVar1;
  DState *s;
  bz_stream *strm_local;
  
  if (strm == (bz_stream *)0x0) {
    strm_local._4_4_ = -2;
  }
  else {
    plVar1 = (long *)strm->state;
    if (plVar1 == (long *)0x0) {
      strm_local._4_4_ = -2;
    }
    else if ((bz_stream *)*plVar1 == strm) {
      if (plVar1[0x18a] != 0) {
        (*strm->bzfree)(strm->opaque,(void *)plVar1[0x18a]);
      }
      if (plVar1[0x18b] != 0) {
        (*strm->bzfree)(strm->opaque,(void *)plVar1[0x18b]);
      }
      if (plVar1[0x18c] != 0) {
        (*strm->bzfree)(strm->opaque,(void *)plVar1[0x18c]);
      }
      (*strm->bzfree)(strm->opaque,strm->state);
      strm->state = (void *)0x0;
      strm_local._4_4_ = 0;
    }
    else {
      strm_local._4_4_ = -2;
    }
  }
  return strm_local._4_4_;
}

Assistant:

int BZ_API(BZ2_bzDecompressEnd)  ( bz_stream *strm )
{
   DState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   if (s->tt   != NULL) BZFREE(s->tt);
   if (s->ll16 != NULL) BZFREE(s->ll16);
   if (s->ll4  != NULL) BZFREE(s->ll4);

   BZFREE(strm->state);
   strm->state = NULL;

   return BZ_OK;
}